

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

GLFWgammaramp * glfwGetGammaRamp(GLFWmonitor *handle)

{
  GLFWgammaramp *ramp;
  GLFWbool GVar1;
  GLFWgammaramp *pGVar2;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("monitor != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/monitor.c"
                  ,0x1f7,"const GLFWgammaramp *glfwGetGammaRamp(GLFWmonitor *)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    pGVar2 = (GLFWgammaramp *)0x0;
  }
  else {
    ramp = (GLFWgammaramp *)(handle + 0xe0);
    _glfwFreeGammaArrays(ramp);
    GVar1 = _glfwPlatformGetGammaRamp((_GLFWmonitor *)handle,ramp);
    pGVar2 = (GLFWgammaramp *)0x0;
    if (GVar1 != 0) {
      pGVar2 = ramp;
    }
  }
  return pGVar2;
}

Assistant:

GLFWAPI const GLFWgammaramp* glfwGetGammaRamp(GLFWmonitor* handle)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    _glfwFreeGammaArrays(&monitor->currentRamp);
    if (!_glfwPlatformGetGammaRamp(monitor, &monitor->currentRamp))
        return NULL;

    return &monitor->currentRamp;
}